

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.cpp
# Opt level: O0

void __thiscall
Diligent::SRBMemoryAllocator::Initialize
          (SRBMemoryAllocator *this,Uint32 SRBAllocationGranularity,
          Uint32 ShaderVariableDataAllocatorCount,size_t *ShaderVariableDataSizes,
          Uint32 ResourceCacheDataAllocatorCount,size_t *ResourceCacheDataSizes)

{
  FixedBlockMemoryAllocator *pFVar1;
  uint uVar2;
  int iVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  IMemoryAllocator *RawMemoryAllocator;
  size_t local_c0;
  size_t size;
  Uint32 s;
  void *pAllocatorsRawMem;
  undefined1 local_80 [4];
  Uint32 TotalAllocatorCount;
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  size_t *ResourceCacheDataSizes_local;
  Uint32 ResourceCacheDataAllocatorCount_local;
  size_t *ShaderVariableDataSizes_local;
  Uint32 ShaderVariableDataAllocatorCount_local;
  Uint32 SRBAllocationGranularity_local;
  SRBMemoryAllocator *this_local;
  
  msg.field_2._8_8_ = ResourceCacheDataSizes;
  if (SRBAllocationGranularity < 2) {
    FormatString<char[26],char[29]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SRBAllocationGranularity > 1",(char (*) [29])ShaderVariableDataSizes)
    ;
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
               ,0x34);
    std::__cxx11::string::~string((string *)local_50);
  }
  if (((this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) ||
      (this->m_ShaderVariableDataAllocatorCount != 0)) ||
     (this->m_ResourceCacheDataAllocatorCount != 0)) {
    FormatString<char[33]>((string *)local_80,(char (*) [33])"Allocator is already initialized");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
               ,0x35);
    std::__cxx11::string::~string((string *)local_80);
  }
  this->m_ShaderVariableDataAllocatorCount = ShaderVariableDataAllocatorCount;
  this->m_ResourceCacheDataAllocatorCount = ResourceCacheDataAllocatorCount;
  uVar2 = this->m_ShaderVariableDataAllocatorCount + this->m_ResourceCacheDataAllocatorCount;
  if (uVar2 != 0) {
    iVar3 = (**this->m_RawMemAllocator->_vptr_IMemoryAllocator)
                      (this->m_RawMemAllocator,(ulong)uVar2 * 0x130,
                       "Raw memory for SRBMemoryAllocator::m_ShaderVariableDataAllocators",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
                       ,0x41);
    this->m_DataAllocators = (FixedBlockMemoryAllocator *)CONCAT44(extraout_var,iVar3);
    for (size._4_4_ = 0; size._4_4_ < uVar2; size._4_4_ = size._4_4_ + 1) {
      if (size._4_4_ < ShaderVariableDataAllocatorCount) {
        local_c0 = ShaderVariableDataSizes[size._4_4_];
      }
      else {
        local_c0 = *(size_t *)
                    (msg.field_2._8_8_ + (ulong)(size._4_4_ - ShaderVariableDataAllocatorCount) * 8)
        ;
      }
      pFVar1 = this->m_DataAllocators;
      RawMemoryAllocator = GetRawAllocator();
      FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
                (pFVar1 + size._4_4_,RawMemoryAllocator,local_c0,SRBAllocationGranularity);
    }
  }
  return;
}

Assistant:

void SRBMemoryAllocator::Initialize(Uint32              SRBAllocationGranularity,
                                    Uint32              ShaderVariableDataAllocatorCount,
                                    const size_t* const ShaderVariableDataSizes,
                                    Uint32              ResourceCacheDataAllocatorCount,
                                    const size_t* const ResourceCacheDataSizes)
{
    VERIFY_EXPR(SRBAllocationGranularity > 1);
    VERIFY(m_DataAllocators == nullptr && m_ShaderVariableDataAllocatorCount == 0 && m_ResourceCacheDataAllocatorCount == 0, "Allocator is already initialized");

    m_ShaderVariableDataAllocatorCount = ShaderVariableDataAllocatorCount;
    m_ResourceCacheDataAllocatorCount  = ResourceCacheDataAllocatorCount;
    auto TotalAllocatorCount           = m_ShaderVariableDataAllocatorCount + m_ResourceCacheDataAllocatorCount;

    if (TotalAllocatorCount == 0)
        return;

    auto* pAllocatorsRawMem = m_RawMemAllocator.Allocate(
        sizeof(FixedBlockMemoryAllocator) * TotalAllocatorCount,
        "Raw memory for SRBMemoryAllocator::m_ShaderVariableDataAllocators",
        __FILE__, __LINE__);
    m_DataAllocators = reinterpret_cast<FixedBlockMemoryAllocator*>(pAllocatorsRawMem);

    for (Uint32 s = 0; s < TotalAllocatorCount; ++s)
    {
        auto size = s < ShaderVariableDataAllocatorCount ? ShaderVariableDataSizes[s] : ResourceCacheDataSizes[s - ShaderVariableDataAllocatorCount];
        new (m_DataAllocators + s) FixedBlockMemoryAllocator(GetRawAllocator(), size, SRBAllocationGranularity);
    }
}